

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper.cpp
# Opt level: O2

uint __thiscall
Mapper::mapLabel(Mapper *this,string *label,uint instructionIndex,
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *labelMap,
                vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *instructions,
                int64_t *value)

{
  uint uVar1;
  ulong uVar2;
  pointer pAVar3;
  uint uVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  out_of_range anon_var_0;
  
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)labelMap,label);
  uVar2 = *pmVar5;
  uVar10 = (ulong)instructionIndex;
  uVar4 = 0;
  if (uVar2 != uVar10) {
    pAVar3 = (instructions->
             super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar10 < uVar2) {
      uVar11 = 10;
      if (pAVar3[uVar10].length != 0) {
        uVar11 = (ulong)pAVar3[uVar10].length;
      }
      uVar8 = instructionIndex + 1;
      do {
        uVar9 = (ulong)uVar8;
        if (uVar2 <= uVar9) goto LAB_00116003;
        uVar11 = uVar11 + pAVar3[uVar9].length;
        uVar8 = uVar8 + 1;
      } while ((ulong)pAVar3[uVar9].length != 0);
    }
    else {
      lVar7 = 0;
      uVar4 = instructionIndex - 1;
      do {
        uVar8 = uVar4;
        if (uVar8 < (uint)uVar2) goto LAB_00116000;
        uVar1 = pAVar3[uVar8].length;
        lVar7 = lVar7 + (ulong)uVar1;
      } while ((uVar8 != 0) && (uVar4 = uVar8 - 1, uVar1 != 0));
      uVar4 = 0;
      if (uVar1 != 0 && uVar8 == 0) {
LAB_00116000:
        uVar11 = -lVar7;
LAB_00116003:
        *value = uVar11;
        poVar6 = std::operator<<((ostream *)&std::cout,"delta ");
        poVar6 = std::ostream::_M_insert<long>((long)poVar6);
        std::endl<char,std::char_traits<char>>(poVar6);
        uVar4 = (instructions->
                super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar10].length;
        if (uVar4 == 0) {
          lVar7 = *value;
          if ((char)lVar7 == lVar7) {
            uVar4 = 1;
            if ((long)uVar11 < 1) {
              return 1;
            }
            lVar7 = lVar7 + -7;
          }
          else if (lVar7 + 0x8000U < 0xffff) {
            uVar4 = 2;
            if ((long)uVar11 < 1) {
              return 2;
            }
            lVar7 = lVar7 + -1;
          }
          else {
            if (0xfffffffe < lVar7 + 0x80000000U) {
              return 8;
            }
            uVar4 = 4;
            if ((long)uVar11 < 1) {
              return 4;
            }
            lVar7 = lVar7 + -3;
          }
          *value = lVar7;
        }
        else {
          uVar4 = uVar4 - 2;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned int Mapper::mapLabel(std::string label, unsigned int instructionIndex, std::unordered_map<std::string, size_t> labelMap,
	std::vector<AssemberInstruction> &instructions, int64_t &value) {

	size_t labelIndex;
	try {
		labelIndex = labelMap.at(label);
	}
	catch (std::out_of_range) {
		return 0;
	}
	if (labelIndex == instructionIndex) {
		return 0;
	}
	int64_t delta;
	if (labelIndex > instructionIndex) {
		delta = (instructions[instructionIndex].length) ? instructions[instructionIndex].length : sizeof(uint64_t) + 2; // assume max length for the jump instruction (10 bytes)
		for (unsigned int i = instructionIndex + 1; i < labelIndex; i++) {
			size_t instructionLength = instructions[i].length;
			int unAssembled = 0;
			if (instructionLength == 0) {
				// Instruction hasn't been assembled yet because it contains label that hasn't been resolved, thus it's length is unknown
				unAssembled++;
				return 0;
			}
			else {
				delta += instructionLength;
			}
			if (unAssembled) {
				// assume the unassembled instructions will take max space
				delta += (unAssembled * (2 + sizeof(uint64_t)));
			}
		}
	}
	else {
		delta = 0; // assume max length for the jump instruction (10 bytes)
		for (unsigned int i = instructionIndex - 1; i >= labelIndex; i--) {
			size_t instructionLength = instructions[i].length;
			int unAssembled = 0;
			if (instructionLength == 0) {
				// Instruction hasn't been assembled yet because it contains label that hasn't been resolved, thus it's length is unknown
				unAssembled++;
				return 0;
			}
			else {
				delta += instructionLength;
			}
			if (unAssembled) {
				// assume the unassembled instructions will take max space
				delta += (unAssembled * (2 + sizeof(uint64_t)));
			}
			if (i == 0)
				break;
		}
		delta = -delta;
	}
	value = delta;
	std::cout << "delta " << delta << std::endl;
	if (instructions[instructionIndex].length) {
		return instructions[instructionIndex].length - 2;
	}
	if (SCHAR_MIN <= value && value <= SCHAR_MAX) {
		if (delta > 0)
			value -= (sizeof(int64_t) - sizeof(int8_t));
		return sizeof(int8_t);
	}
	else if (SHRT_MIN <= value && value <= SHRT_MAX - 1) {
		if (delta > 0)
			value -= sizeof(int16_t) - sizeof(int8_t);
		return sizeof(int16_t);
	}
	else if (INT32_MIN <= value && value <= INT32_MAX - 1) {
		if (delta > 0)
			value -= sizeof(int32_t) - sizeof(int8_t);
		return sizeof(int32_t);
	}
	return sizeof(int64_t);
}